

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uxsel.c
# Opt level: O0

int next_fd(int *state,int *rwx)

{
  int index;
  tree234 *t;
  int *piVar1;
  fd *fd;
  int *rwx_local;
  int *state_local;
  
  t = fds;
  index = *state;
  *state = index + 1;
  piVar1 = (int *)index234(t,index);
  if (piVar1 == (int *)0x0) {
    state_local._4_4_ = -1;
  }
  else {
    *rwx = piVar1[1];
    state_local._4_4_ = *piVar1;
  }
  return state_local._4_4_;
}

Assistant:

int next_fd(int *state, int *rwx)
{
    struct fd *fd;
    fd = index234(fds, (*state)++);
    if (fd) {
        *rwx = fd->rwx;
        return fd->fd;
    } else
        return -1;
}